

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O2

void __thiscall duckdb::PreparedStatement::~PreparedStatement(PreparedStatement *this)

{
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->named_param_map)._M_h);
  ErrorData::~ErrorData(&this->error);
  ::std::__cxx11::string::~string((string *)&this->query);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->data).internal.
              super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->context).internal.
              super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

PreparedStatement::~PreparedStatement() {
}